

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbox.hpp
# Opt level: O0

void __thiscall
so_5::abstract_message_box_t::deliver_message<so_5::stats::messages::quantity<unsigned_long>>
          (abstract_message_box_t *this,type_index subscription_type,
          unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
          *msg_unique_ptr,message_mutability_t mutability)

{
  pointer pqVar1;
  type what;
  intrusive_ptr_t<so_5::message_t> local_30;
  message_mutability_t local_24;
  unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
  *puStack_20;
  message_mutability_t mutability_local;
  unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
  *msg_unique_ptr_local;
  abstract_message_box_t *this_local;
  type_index subscription_type_local;
  
  local_24 = mutability;
  puStack_20 = msg_unique_ptr;
  msg_unique_ptr_local =
       (unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
        *)this;
  this_local = (abstract_message_box_t *)subscription_type._M_target;
  ensure_classical_message<so_5::stats::messages::quantity<unsigned_long>>();
  pqVar1 = std::
           unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
           ::get(msg_unique_ptr);
  ensure_message_with_actual_data<so_5::stats::messages::quantity<unsigned_long>>(pqVar1);
  what = std::
         unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
         ::operator*(msg_unique_ptr);
  change_message_mutability(&what->super_message_t,local_24);
  pqVar1 = std::
           unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
           ::release(msg_unique_ptr);
  intrusive_ptr_t<so_5::message_t>::intrusive_ptr_t(&local_30,&pqVar1->super_message_t);
  deliver_message(this,(type_index *)&this_local,&local_30);
  intrusive_ptr_t<so_5::message_t>::~intrusive_ptr_t(&local_30);
  return;
}

Assistant:

inline void
abstract_message_box_t::deliver_message(
	std::type_index subscription_type,
	std::unique_ptr< MESSAGE > msg_unique_ptr,
	message_mutability_t mutability ) const
{
	ensure_classical_message< MESSAGE >();
	ensure_message_with_actual_data( msg_unique_ptr.get() );

	change_message_mutability( *msg_unique_ptr, mutability );

	deliver_message(
		subscription_type,
		message_ref_t( msg_unique_ptr.release() ) );
}